

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O0

Task * __thiscall
(anonymous_namespace)::BuildEngineTest_CycleDuringScanningFromTop_Test::TestBody()::CycleRule::
createTask(llbuild::core::BuildEngine__(void *this,BuildEngine *param_1)

{
  SimpleTask *this_00;
  function<int_(const_std::vector<int,_std::allocator<int>_>_&)> local_58;
  function<std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>_()> local_38
  ;
  BuildEngine *local_18;
  BuildEngine *param_1_local;
  CycleRule *this_local;
  
  local_18 = param_1;
  param_1_local = (BuildEngine *)this;
  this_00 = (SimpleTask *)operator_new(0x60);
  std::function<std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>_()>::
  function(&local_38,
           (function<std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>_()>
            *)((long)this + 0x30));
  std::function<int_(const_std::vector<int,_std::allocator<int>_>_&)>::function
            (&local_58,
             (function<int_(const_std::vector<int,_std::allocator<int>_>_&)> *)((long)this + 0x50));
  anon_unknown.dwarf_1e0a3::SimpleTask::SimpleTask(this_00,&local_38,&local_58);
  std::function<int_(const_std::vector<int,_std::allocator<int>_>_&)>::~function(&local_58);
  std::function<std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>_()>::
  ~function(&local_38);
  return &this_00->super_Task;
}

Assistant:

Task* createTask(BuildEngine&) override {
      return new SimpleTask(input, compute);
    }